

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void duckdb_parquet::swap(DataPageHeader *a,DataPageHeader *b)

{
  _DataPageHeader__isset _Var1;
  type tVar2;
  int32_t iVar3;
  type tVar4;
  
  tVar2 = b->encoding;
  iVar3 = a->num_values;
  tVar4 = a->encoding;
  a->num_values = b->num_values;
  a->encoding = tVar2;
  b->num_values = iVar3;
  b->encoding = tVar4;
  tVar2 = a->definition_level_encoding;
  a->definition_level_encoding = b->definition_level_encoding;
  b->definition_level_encoding = tVar2;
  tVar2 = a->repetition_level_encoding;
  a->repetition_level_encoding = b->repetition_level_encoding;
  b->repetition_level_encoding = tVar2;
  swap(&a->statistics,&b->statistics);
  _Var1 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var1;
  return;
}

Assistant:

void swap(DataPageHeader &a, DataPageHeader &b) {
  using ::std::swap;
  swap(a.num_values, b.num_values);
  swap(a.encoding, b.encoding);
  swap(a.definition_level_encoding, b.definition_level_encoding);
  swap(a.repetition_level_encoding, b.repetition_level_encoding);
  swap(a.statistics, b.statistics);
  swap(a.__isset, b.__isset);
}